

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O1

void compile_matchingpath
               (compiler_common *common,PCRE2_SPTR16 cc,PCRE2_SPTR16 ccend,backtrack_common *parent)

{
  sljit_u8 sVar1;
  ushort uVar2;
  sljit_compiler *compiler;
  sljit_compiler *psVar3;
  sljit_compiler *psVar4;
  ushort uVar5;
  bool bVar6;
  BOOL BVar7;
  PCRE2_UCHAR16 PVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  then_trap_backtrack *ptVar12;
  sljit_u8 *psVar13;
  sljit_jump *psVar14;
  stub_list *psVar15;
  jump_list **ppjVar16;
  long lVar17;
  sljit_label *psVar18;
  assert_backtrack *backtrack;
  PCRE2_SPTR16 pPVar19;
  jump_list *pjVar20;
  backtrack_common *pbVar21;
  recurse_entry *prVar22;
  backtrack_common *pbVar23;
  sljit_label *psVar24;
  jump_list **ppjVar25;
  ulong uVar26;
  sljit_sw offset;
  bool bVar27;
  long *plVar28;
  sljit_s32 sVar29;
  PCRE2_SPTR16 cc_00;
  long *plVar30;
  recurse_entry *prVar31;
  compiler_common *cc_01;
  ushort uVar32;
  int iVar33;
  sljit_s32 sVar34;
  sljit_sw sVar35;
  long lVar36;
  compiler_common *common_00;
  ulong src2w;
  int iVar37;
  ulong srcw;
  int iVar38;
  ulong uVar39;
  int iVar40;
  backtrack_common *local_f8;
  sljit_sw local_e0;
  uint local_b0;
  ushort local_a4;
  BOOL needs_control_head;
  int local_90;
  int iStack_8c;
  then_trap_backtrack *local_80;
  ulong local_78;
  long local_70;
  ulong local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  long local_48;
  recurse_entry *local_40;
  long local_38;
  
  compiler = common->compiler;
  if ((common->has_then == 0) || (common->then_offsets[(long)cc - (long)common->start >> 1] == '\0')
     ) {
    bVar6 = true;
    local_80 = (then_trap_backtrack *)0x0;
  }
  else {
    local_80 = common->then_trap;
    if (compiler->error == 0) {
      ptVar12 = (then_trap_backtrack *)ensure_abuf(compiler,0x48);
    }
    else {
      ptVar12 = (then_trap_backtrack *)0x0;
    }
    if (compiler->error == 0) {
      ptVar12->start = 0;
      ptVar12->quit = (jump_list *)0x0;
      (ptVar12->common).cc = (PCRE2_SPTR16)0x0;
      ptVar12->then_trap = (then_trap_backtrack *)0x0;
      (ptVar12->common).top = (backtrack_common *)0x0;
      (ptVar12->common).topbacktracks = (jump_list *)0x0;
      (ptVar12->common).prev = (backtrack_common *)0x0;
      (ptVar12->common).nextbacktracks = (jump_list *)0x0;
      *(undefined8 *)&ptVar12->framesize = 0;
      (ptVar12->common).prev = parent->top;
      (ptVar12->common).cc = cc;
      parent->top = &ptVar12->common;
      common->then_trap = ptVar12;
      (ptVar12->common).cc = then_trap_opcode;
      ptVar12->start = (long)cc - (long)common->start >> 1;
      uVar39 = 0;
      uVar9 = get_framesize(common,cc,ccend,0,&needs_control_head);
      if (0 < (int)uVar9) {
        uVar39 = (ulong)uVar9;
      }
      ptVar12->framesize = uVar9;
      if (compiler->error == 0) {
        iVar10 = common->control_head_ptr;
        compiler->mode32 = 0;
        psVar13 = emit_x86_instruction(compiler,1,4,0,0x8e,(long)iVar10);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x8b;
        }
      }
      psVar3 = common->compiler;
      psVar15 = (stub_list *)0x0;
      sljit_emit_op2(psVar3,0x62,0xc,0,0xc,0,0x40,(ulong)((int)uVar39 + 3) << 3);
      iVar10 = 0xb;
      psVar14 = sljit_emit_cmp(psVar3,2,0xc,0,0xb,0);
      psVar3 = common->compiler;
      if (psVar3->error == 0) {
        psVar15 = (stub_list *)ensure_abuf(psVar3,0x18);
      }
      if (psVar15 != (stub_list *)0x0) {
        psVar15->start = psVar14;
        psVar24 = sljit_emit_label(psVar3);
        psVar15->quit = psVar24;
        psVar15->next = common->stubs;
        common->stubs = psVar15;
      }
      if ((int)uVar9 < 1) {
        if (compiler->error == 0) {
          iVar38 = common->control_head_ptr;
          compiler->mode32 = 0;
          iVar10 = 0x8e;
          psVar13 = emit_x86_instruction(compiler,1,0xc,0,0x8e,(long)iVar38);
          if (psVar13 != (sljit_u8 *)0x0) {
            *psVar13 = 0x89;
          }
        }
      }
      else {
        iVar10 = 0xc;
        sljit_emit_op2(compiler,0x60,0x8e,(long)common->control_head_ptr,0xc,0,0x40,uVar39 << 3);
      }
      uVar9 = (int)uVar39 * 8;
      if (compiler->error == 0) {
        sVar35 = ptVar12->start;
        compiler->mode32 = 0;
        emit_mov(compiler,0x8c,(ulong)(uVar9 + 0x10),0x40,sVar35);
        iVar10 = (int)sVar35;
      }
      if (compiler->error == 0) {
        compiler->mode32 = 0;
        iVar10 = 0x8c;
        psVar13 = emit_x86_instruction(compiler,1,0x40,1,0x8c,(long)(int)(uVar9 + 8));
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 199;
        }
      }
      if (compiler->error == 0) {
        compiler->mode32 = 0;
        iVar10 = 0x8c;
        psVar13 = emit_x86_instruction(compiler,1,4,0,0x8c,(ulong)uVar9);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x89;
        }
      }
      if (-1 < ptVar12->framesize) {
        init_frame(common,cc,ccend,ptVar12->framesize + -1,iVar10);
      }
    }
    bVar6 = false;
  }
  local_40 = (recurse_entry *)&common->entries;
  ppjVar16 = &parent->topbacktracks;
LAB_0010a983:
  if (ccend <= cc) {
    if (bVar6) {
      return;
    }
    if (compiler->error == 0) {
      pbVar23 = (backtrack_common *)ensure_abuf(compiler,0x48);
    }
    else {
      pbVar23 = (backtrack_common *)0x0;
    }
    if (compiler->error != 0) {
      return;
    }
    pbVar23[1].nextbacktracks = (jump_list *)0x0;
    pbVar23[1].top = (backtrack_common *)0x0;
    pbVar23->cc = (PCRE2_SPTR16)0x0;
    pbVar23[1].prev = (backtrack_common *)0x0;
    pbVar23->top = (backtrack_common *)0x0;
    pbVar23->topbacktracks = (jump_list *)0x0;
    pbVar23->prev = (backtrack_common *)0x0;
    pbVar23->nextbacktracks = (jump_list *)0x0;
    pbVar23[1].topbacktracks = (jump_list *)0x0;
    pbVar23->prev = parent->top;
    pbVar23->cc = cc;
    parent->top = pbVar23;
    pbVar23->cc = then_trap_opcode;
    pbVar23[1].prev = &common->then_trap->common;
    common->then_trap = local_80;
    return;
  }
  uVar2 = *cc;
  if (0xa2 < uVar2 - 1) {
    return;
  }
  switch((uint)uVar2) {
  case 1:
  case 2:
  case 4:
  case 5:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x7d:
    ppjVar25 = &parent->top->nextbacktracks;
    if (parent->top == (backtrack_common *)0x0) {
      ppjVar25 = ppjVar16;
    }
    pPVar19 = compile_simple_assertion_matchingpath(common,uVar2,cc + 1,ppjVar25);
    break;
  case 3:
    if (compiler->error == 0) {
      pbVar23 = (backtrack_common *)ensure_abuf(compiler,0x28);
    }
    else {
      pbVar23 = (backtrack_common *)0x0;
    }
    if (compiler->error != 0) {
      return;
    }
    pbVar23->cc = (PCRE2_SPTR16)0x0;
    pbVar23->top = (backtrack_common *)0x0;
    pbVar23->topbacktracks = (jump_list *)0x0;
    pbVar23->prev = (backtrack_common *)0x0;
    pbVar23->nextbacktracks = (jump_list *)0x0;
    pbVar23->prev = parent->top;
    pbVar23->cc = cc;
    parent->top = pbVar23;
    if (compiler->error == 0) {
      iVar10 = common->ovector_start;
      compiler->mode32 = 0;
      psVar13 = emit_x86_instruction(compiler,1,4,0,0x8e,(long)iVar10);
      if (psVar13 != (sljit_u8 *)0x0) {
        *psVar13 = 0x8b;
      }
    }
    psVar3 = common->compiler;
    sljit_emit_op2(psVar3,0x62,0xc,0,0xc,0,0x40,8);
    psVar14 = sljit_emit_cmp(psVar3,2,0xc,0,0xb,0);
    psVar3 = common->compiler;
    psVar15 = (stub_list *)0x0;
    if (psVar3->error == 0) {
      psVar15 = (stub_list *)ensure_abuf(psVar3,0x18);
    }
    if (psVar15 != (stub_list *)0x0) {
      psVar15->start = psVar14;
      psVar24 = sljit_emit_label(psVar3);
      psVar15->quit = psVar24;
      psVar15->next = common->stubs;
      common->stubs = psVar15;
    }
    if (compiler->error == 0) {
      iVar10 = common->ovector_start;
      compiler->mode32 = 0;
      psVar13 = emit_x86_instruction(compiler,1,2,0,0x8e,(long)iVar10);
      if (psVar13 != (sljit_u8 *)0x0) {
        *psVar13 = 0x89;
      }
    }
    if (compiler->error == 0) {
      compiler->mode32 = 0;
      psVar13 = emit_x86_instruction(compiler,1,4,0,0x8c,0);
      if (psVar13 != (sljit_u8 *)0x0) {
        *psVar13 = 0x89;
      }
    }
    goto LAB_0010c791;
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x1f:
  case 0x20:
    goto switchD_0010a9af_caseD_6;
  case 0x1d:
  case 0x1e:
    if (common->mode != 1) goto switchD_0010a9af_caseD_6;
    ppjVar25 = &parent->top->nextbacktracks;
    if (parent->top == (backtrack_common *)0x0) {
      ppjVar25 = ppjVar16;
    }
    psVar3 = common->compiler;
    needs_control_head = 0;
    pPVar19 = cc;
    while (pPVar19 < ccend) {
      bVar27 = true;
      uVar9 = 1;
      if (*pPVar19 != 0x1d) {
        if (*pPVar19 == 0x1e) {
          uVar2 = pPVar19[1];
          if (((ulong)uVar2 < 0x100) &&
             (uVar32 = (ushort)common->fcc[uVar2], uVar9 = 1, uVar2 != uVar32)) {
            uVar5 = uVar32 ^ uVar2;
            if ((0x7f < uVar2) || (bVar27 = true, uVar5 != 0x20)) {
              bVar27 = uVar32 != uVar2 && (uVar5 & uVar5 - 1) == 0;
            }
            uVar9 = (uint)bVar27;
          }
        }
        else {
          bVar27 = false;
          uVar9 = 0;
        }
      }
      needs_control_head = needs_control_head + uVar9 * 2;
      if ((bVar27 == false) ||
         (pPVar19 = (PCRE2_SPTR16)((long)pPVar19 + (ulong)(uVar9 * 2) + 2),
         0x80 < (uint)needs_control_head)) break;
    }
    if (needs_control_head < 1) {
      pPVar19 = compile_char1_matchingpath(common,*cc,cc + 1,ppjVar25,1);
    }
    else {
      sljit_emit_op2(psVar3,0x60,2,0,2,0,0x40,(ulong)(uint)needs_control_head);
      psVar14 = sljit_emit_cmp(psVar3,4,2,0,0xd,0);
      pjVar20 = (jump_list *)0x0;
      if (psVar3->error == 0) {
        pjVar20 = (jump_list *)ensure_abuf(psVar3,0x10);
      }
      if (pjVar20 != (jump_list *)0x0) {
        pjVar20->next = *ppjVar25;
        pjVar20->jump = psVar14;
        *ppjVar25 = pjVar20;
      }
      local_90 = -1;
      iStack_8c = 0;
      pPVar19 = cc;
      do {
        pPVar19 = byte_sequence_compare
                            (common,(uint)(*pPVar19 == 0x1e),pPVar19 + 1,
                             (compare_context *)&needs_control_head,ppjVar25);
      } while (0 < needs_control_head);
    }
    break;
  default:
    goto switchD_0010a9af_caseD_21;
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x78:
  case 0x79:
  case 0x7a:
  case 0x7b:
  case 0x7c:
  case 0x8d:
  case 0x8e:
  case 0x8f:
  case 0x90:
  case 0x91:
  case 0x92:
    goto switchD_0010a9af_caseD_62;
  case 0x6e:
  case 0x6f:
    PVar8 = cc[0x11];
    goto LAB_0010c4cb;
  case 0x70:
    PVar8 = cc[cc[1]];
LAB_0010c4cb:
    if ((ushort)(PVar8 - 0x62) < 0xc) {
switchD_0010a9af_caseD_21:
      pPVar19 = compile_iterator_matchingpath(common,cc,parent);
    }
    else {
switchD_0010a9af_caseD_6:
      ppjVar25 = &parent->top->nextbacktracks;
      if (parent->top == (backtrack_common *)0x0) {
        ppjVar25 = ppjVar16;
      }
      pPVar19 = compile_char1_matchingpath(common,uVar2,cc + 1,ppjVar25,1);
    }
    break;
  case 0x71:
  case 0x72:
    if (0xb < (ushort)(cc[2] - 0x62)) {
      pPVar19 = cc + 2;
      ppjVar25 = &parent->top->nextbacktracks;
      if (parent->top == (backtrack_common *)0x0) {
        ppjVar25 = ppjVar16;
      }
      goto LAB_0010d212;
    }
LAB_0010ceab:
    pPVar19 = compile_ref_iterator_matchingpath(common,cc,parent);
    break;
  case 0x73:
  case 0x74:
    if ((ushort)(cc[3] - 0x62) < 0xc) goto LAB_0010ceab;
    pPVar19 = cc + 3;
    ppjVar25 = &parent->top->nextbacktracks;
    if (parent->top == (backtrack_common *)0x0) {
      ppjVar25 = ppjVar16;
    }
    compile_dnref_search(common,cc,ppjVar25);
    ppjVar25 = &parent->top->nextbacktracks;
    if (parent->top == (backtrack_common *)0x0) {
      ppjVar25 = ppjVar16;
    }
LAB_0010d212:
    compile_ref_matchingpath(common,cc,ppjVar25,1,0);
    break;
  case 0x75:
    psVar3 = common->compiler;
    prVar22 = common->entries;
    uVar2 = cc[1];
    if (psVar3->error == 0) {
      local_f8 = (backtrack_common *)ensure_abuf(psVar3,0x40);
    }
    else {
      local_f8 = (backtrack_common *)0x0;
    }
    if (psVar3->error == 0) {
      local_f8[1].nextbacktracks = (jump_list *)0x0;
      local_f8[1].top = (backtrack_common *)0x0;
      local_f8->cc = (PCRE2_SPTR16)0x0;
      local_f8[1].prev = (backtrack_common *)0x0;
      local_f8->top = (backtrack_common *)0x0;
      local_f8->topbacktracks = (jump_list *)0x0;
      local_f8->prev = (backtrack_common *)0x0;
      local_f8->nextbacktracks = (jump_list *)0x0;
      local_f8->prev = parent->top;
      local_f8->cc = cc;
      parent->top = local_f8;
      common_00 = (compiler_common *)((ulong)((uint)uVar2 * 2) + (long)common->start);
      cc_01 = common_00;
      iVar10 = get_framesize(common,(PCRE2_SPTR16)common_00,(PCRE2_SPTR16)0x0,1,&needs_control_head)
      ;
      if (iVar10 == -2) {
        pPVar19 = next_opcode(common_00,(PCRE2_SPTR16)cc_01);
        do {
          common_00 = (compiler_common *)
                      ((long)&common_00->compiler +
                      (ulong)*(PCRE2_SPTR16)((long)&common_00->compiler + 2) * 2);
        } while (*(PCRE2_UCHAR16 *)&common_00->compiler == 0x78);
        compile_matchingpath(common,pPVar19,(PCRE2_SPTR16)common_00,local_f8);
        *(undefined4 *)&local_f8[1].top = 1;
      }
      else {
        if (prVar22 == (recurse_entry *)0x0) {
          prVar31 = (recurse_entry *)0x0;
        }
        else {
          do {
            prVar31 = prVar22;
            if (prVar31->start == (ulong)uVar2) goto LAB_0010cd2d;
            prVar22 = prVar31->next;
          } while (prVar31->next != (recurse_entry *)0x0);
        }
        if (psVar3->error == 0) {
          prVar22 = (recurse_entry *)ensure_abuf(psVar3,0x30);
        }
        else {
          prVar22 = (recurse_entry *)0x0;
        }
        if (psVar3->error != 0) {
LAB_0010d36c:
          pPVar19 = (PCRE2_SPTR16)0x0;
          break;
        }
        prVar22->backtrack_label = (sljit_label *)0x0;
        prVar22->entry_calls = (jump_list *)0x0;
        prVar22->next = (recurse_entry *)0x0;
        prVar22->entry_label = (sljit_label *)0x0;
        prVar22->backtrack_calls = (jump_list *)0x0;
        prVar22->start = (ulong)uVar2;
        if (prVar31 == (recurse_entry *)0x0) {
          prVar31 = local_40;
        }
        prVar31->next = prVar22;
        prVar31 = prVar22;
LAB_0010cd2d:
        local_f8[1].nextbacktracks = (jump_list *)prVar31;
        if (prVar31->entry_label == (sljit_label *)0x0) {
          psVar14 = sljit_emit_jump(psVar3,0x19);
          if (psVar3->error == 0) {
            pjVar20 = (jump_list *)ensure_abuf(psVar3,0x10);
          }
          else {
            pjVar20 = (jump_list *)0x0;
          }
          if (pjVar20 != (jump_list *)0x0) {
            pjVar20->next = prVar31->entry_calls;
            pjVar20->jump = psVar14;
            prVar31->entry_calls = pjVar20;
          }
        }
        else {
          psVar14 = sljit_emit_jump(psVar3,0x19);
          if ((psVar14 != (sljit_jump *)0x0) &&
             (psVar24 = prVar31->entry_label, psVar24 != (sljit_label *)0x0)) {
            psVar14->flags = (psVar14->flags & 0xfffffffffffffffcU) + 1;
            (psVar14->u).target = (sljit_uw)psVar24;
          }
        }
        psVar14 = sljit_emit_cmp(psVar3,0,1,0,0x40,0);
        pjVar20 = (jump_list *)0x0;
        if (psVar3->error == 0) {
          pjVar20 = (jump_list *)ensure_abuf(psVar3,0x10);
        }
        if (pjVar20 != (jump_list *)0x0) {
          pjVar20->next = local_f8->topbacktracks;
          pjVar20->jump = psVar14;
          local_f8->topbacktracks = pjVar20;
        }
        pbVar23 = (backtrack_common *)sljit_emit_label(psVar3);
        local_f8[1].prev = pbVar23;
      }
      goto LAB_0010cdf1;
    }
    pPVar19 = (PCRE2_SPTR16)0x0;
    break;
  case 0x76:
  case 0x77:
    if (uVar2 == 0x76) {
      uVar39 = 4;
    }
    else {
      uVar39 = (ulong)cc[3];
    }
    psVar3 = common->compiler;
    uVar2 = common->re->top_bracket;
    if (psVar3->error == 0) {
      pbVar23 = (backtrack_common *)ensure_abuf(psVar3,0x28);
    }
    else {
      pbVar23 = (backtrack_common *)0x0;
    }
    if (psVar3->error == 0) {
      pbVar23->top = (backtrack_common *)0x0;
      pbVar23->topbacktracks = (jump_list *)0x0;
      pbVar23->cc = (PCRE2_SPTR16)0x0;
      pbVar23->prev = (backtrack_common *)0x0;
      pbVar23->nextbacktracks = (jump_list *)0x0;
      pbVar23->prev = parent->top;
      pbVar23->cc = cc;
      parent->top = pbVar23;
      src2w = (ulong)((uint)uVar2 * 0x10 + 0x80);
      psVar4 = common->compiler;
      sljit_emit_op2(psVar4,0x62,0xc,0,0xc,0,0x40,src2w);
      psVar14 = sljit_emit_cmp(psVar4,2,0xc,0,0xb,0);
      psVar4 = common->compiler;
      psVar15 = (stub_list *)0x0;
      if (psVar4->error == 0) {
        psVar15 = (stub_list *)ensure_abuf(psVar4,0x18);
      }
      if (psVar15 != (stub_list *)0x0) {
        psVar15->start = psVar14;
        psVar24 = sljit_emit_label(psVar4);
        psVar15->quit = psVar24;
        psVar15->next = common->stubs;
        common->stubs = psVar15;
      }
      if (psVar3->error == 0) {
        iVar10 = common->capture_last_ptr;
        psVar3->mode32 = 0;
        psVar13 = emit_x86_instruction(psVar3,1,4,0,0x8e,(long)iVar10);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x8b;
        }
      }
      if (psVar3->error == 0) {
        psVar3->mode32 = 0;
        psVar13 = emit_x86_instruction(psVar3,1,9,0,1,0);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x89;
        }
      }
      if (*cc == 0x76) {
        uVar26 = (ulong)cc[3];
      }
      else {
        uVar26 = 0;
      }
      if (psVar3->error == 0) {
        psVar3->mode32 = 1;
        psVar13 = emit_x86_instruction(psVar3,1,0x40,uVar26,0x8c,4);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 199;
          psVar3->mode32 = 0;
        }
      }
      if (psVar3->error == 0) {
        psVar3->mode32 = 1;
        psVar13 = emit_x86_instruction(psVar3,1,4,0,0x8c,0xc);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x89;
          psVar3->mode32 = 0;
        }
      }
      if (psVar3->error == 0) {
        uVar2 = common->re->top_bracket;
        psVar3->mode32 = 1;
        psVar13 = emit_x86_instruction(psVar3,1,0x40,(ulong)uVar2 + 1,0x8c,8);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 199;
          psVar3->mode32 = 0;
        }
      }
      if (psVar3->error == 0) {
        psVar3->mode32 = 0;
        psVar13 = emit_x86_instruction(psVar3,1,2,0,0x8c,0x10);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x89;
        }
      }
      if ((common->mark_ptr != 0) && (psVar3->error == 0)) {
        psVar3->mode32 = 0;
        psVar13 = emit_x86_instruction(psVar3,1,4,0,0x81,0x30);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x8b;
        }
      }
      if (psVar3->error == 0) {
        uVar2 = cc[1];
        psVar3->mode32 = 0;
        emit_mov(psVar3,0x8c,0x40,0x40,(ulong)uVar2);
      }
      if (psVar3->error == 0) {
        uVar2 = cc[2];
        psVar3->mode32 = 0;
        emit_mov(psVar3,0x8c,0x48,0x40,(ulong)uVar2);
      }
      if (*cc == 0x76) {
        pPVar19 = (PCRE2_SPTR16)0x0;
        srcw = 0;
        uVar26 = 0;
      }
      else {
        pPVar19 = cc + 6;
        srcw = (ulong)((int)uVar39 - 7);
        uVar26 = (ulong)cc[4];
      }
      if (psVar3->error == 0) {
        psVar3->mode32 = 0;
        emit_mov(psVar3,0x8c,0x60,0x40,(sljit_sw)pPVar19);
      }
      if (psVar3->error == 0) {
        psVar3->mode32 = 0;
        emit_mov(psVar3,0x8c,0x58,0x40,srcw);
      }
      if (psVar3->error == 0) {
        psVar3->mode32 = 0;
        emit_mov(psVar3,0x8c,0x50,0x40,uVar26);
      }
      sVar35 = 4;
      if (common->mark_ptr == 0) {
        sVar35 = 0x40;
      }
      offset = 0x18;
      sljit_emit_op1(psVar3,0x20,0x8c,0x18,(sljit_s32)sVar35,0);
      if (psVar3->error == 0) {
        psVar3->mode32 = 0;
        offset = 0;
        sVar35 = 0x8e;
        psVar13 = emit_x86_instruction(psVar3,1,2,0,0x8e,0);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x89;
        }
      }
      if (psVar3->error == 0) {
        psVar3->mode32 = 0;
        offset = 0;
        sVar35 = 2;
        psVar13 = emit_x86_instruction(psVar3,1,0xc,0,2,0);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x89;
        }
      }
      sljit_get_local_base(psVar3,3,(long)common->ovector_start,offset);
      sljit_emit_icall(psVar3,0x1113,0x158ce8,(sljit_s32)offset,sVar35);
      if (psVar3->error == 0) {
        psVar3->mode32 = 0;
        psVar13 = emit_x86_instruction(psVar3,1,2,0,0x8e,0);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x8b;
        }
      }
      sljit_emit_op2(common->compiler,0x60,0xc,0,0xc,0,0x40,src2w);
      if (psVar3->error == 0) {
        psVar3->mode32 = 0x100;
        psVar13 = emit_x86_instruction(psVar3,0x11,0x40,0,1,0);
        if (psVar13 != (sljit_u8 *)0x0) {
          psVar13[1] = psVar13[1] | 0x38;
        }
      }
      psVar14 = sljit_emit_jump(psVar3,0x108);
      if (psVar3->error == 0) {
        pjVar20 = (jump_list *)ensure_abuf(psVar3,0x10);
      }
      else {
        pjVar20 = (jump_list *)0x0;
      }
      if (pjVar20 != (jump_list *)0x0) {
        pjVar20->next = pbVar23->topbacktracks;
        pjVar20->jump = psVar14;
        pbVar23->topbacktracks = pjVar20;
      }
      psVar24 = common->abort_label;
      psVar14 = sljit_emit_jump(psVar3,0x101);
      if (psVar24 == (sljit_label *)0x0) {
        if (psVar3->error == 0) {
          pjVar20 = (jump_list *)ensure_abuf(psVar3,0x10);
        }
        else {
          pjVar20 = (jump_list *)0x0;
        }
        if (pjVar20 != (jump_list *)0x0) {
          pjVar20->next = common->abort;
          pjVar20->jump = psVar14;
          common->abort = pjVar20;
        }
      }
      else if ((psVar14 != (sljit_jump *)0x0) &&
              (psVar24 = common->abort_label, psVar24 != (sljit_label *)0x0)) {
        psVar14->flags = (psVar14->flags & 0xfffffffffffffffcU) + 1;
        (psVar14->u).target = (sljit_uw)psVar24;
      }
      pPVar19 = cc + uVar39;
    }
    else {
LAB_0010d361:
      pPVar19 = (PCRE2_SPTR16)0x0;
    }
    break;
  case 0x7e:
  case 0x7f:
  case 0x80:
  case 0x81:
    goto switchD_0010a9af_caseD_7e;
  case 0x82:
  case 0x83:
  case 0x85:
  case 0x87:
  case 0x88:
  case 0x8a:
  case 0x8c:
switchD_0010a9af_caseD_82:
    pPVar19 = compile_bracket_matchingpath(common,cc,parent);
    break;
  case 0x84:
  case 0x86:
  case 0x89:
  case 0x8b:
  case 0x95:
    psVar3 = common->compiler;
    if (psVar3->error == 0) {
      pbVar23 = (backtrack_common *)ensure_abuf(psVar3,0x38);
    }
    else {
      pbVar23 = (backtrack_common *)0x0;
    }
    if (psVar3->error != 0) goto LAB_0010d361;
    pbVar23->cc = (PCRE2_SPTR16)0x0;
    pbVar23[1].prev = (backtrack_common *)0x0;
    pbVar23->top = (backtrack_common *)0x0;
    pbVar23->topbacktracks = (jump_list *)0x0;
    pbVar23->prev = (backtrack_common *)0x0;
    pbVar23->nextbacktracks = (jump_list *)0x0;
    pbVar23[1].nextbacktracks = (jump_list *)0x0;
    pbVar23->prev = parent->top;
    pbVar23->cc = cc;
    parent->top = pbVar23;
    PVar8 = *cc;
    pPVar19 = cc + (PVar8 == 0x95);
    uVar2 = *pPVar19;
    local_78 = (ulong)uVar2;
    iVar10 = *(int *)((long)common->private_data_ptrs + ((long)pPVar19 - (long)common->start) * 2);
    lVar17 = (long)iVar10;
    *(int *)&pbVar23[1].prev = iVar10;
    uVar39 = 0;
    cc_00 = (PCRE2_SPTR16)0x0;
    local_e0 = 0;
    switch(uVar2) {
    case 0x84:
    case 0x89:
      cc_00 = pPVar19 + 2;
      local_e0 = 0;
      uVar39 = 0;
      break;
    case 0x86:
    case 0x8b:
      uVar39 = (ulong)((uint)pPVar19[2] * 2);
      cc_00 = pPVar19 + 3;
      local_e0 = (sljit_sw)(int)((uint)pPVar19[2] * 8 + common->cbra_ptr);
    }
    iVar10 = get_framesize(common,pPVar19,(PCRE2_SPTR16)0x0,0,&needs_control_head);
    BVar7 = needs_control_head;
    *(int *)((long)&pbVar23[1].prev + 4) = iVar10;
    iVar38 = (int)uVar39;
    if (iVar10 < 0) {
      iVar11 = 1;
      if (iVar38 != 0) {
        iVar11 = 3 - (uint)(common->capture_last_ptr == 0);
      }
      local_b0 = ((uint)(PVar8 != 0x95) + iVar11 + 1) - (uint)(needs_control_head == 0);
      *(uint *)&pbVar23[1].nextbacktracks = local_b0;
      psVar4 = common->compiler;
      sljit_emit_op2(psVar4,0x62,0xc,0,0xc,0,0x40,(ulong)(local_b0 * 8));
      psVar14 = sljit_emit_cmp(psVar4,2,0xc,0,0xb,0);
      psVar4 = common->compiler;
      psVar15 = (stub_list *)0x0;
      if (psVar4->error == 0) {
        psVar15 = (stub_list *)ensure_abuf(psVar4,0x18);
      }
      if (psVar15 != (stub_list *)0x0) {
        psVar15->start = psVar14;
        psVar24 = sljit_emit_label(psVar4);
        psVar15->quit = psVar24;
        psVar15->next = common->stubs;
        common->stubs = psVar15;
      }
      if ((iVar10 == -1) && (psVar3->error == 0)) {
        psVar3->mode32 = 0;
        psVar13 = emit_x86_instruction(psVar3,1,0xc,0,0x8e,lVar17);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x89;
        }
      }
      if (iVar38 == 0) {
        if ((BVar7 != 0) && (psVar3->error == 0)) {
          iVar11 = common->control_head_ptr;
          psVar3->mode32 = 0;
          psVar13 = emit_x86_instruction(psVar3,1,4,0,0x8e,(long)iVar11);
          if (psVar13 != (sljit_u8 *)0x0) {
            *psVar13 = 0x8b;
          }
        }
        iVar11 = 1;
        if (psVar3->error == 0) {
          psVar3->mode32 = 0;
          iVar11 = 1;
          psVar13 = emit_x86_instruction(psVar3,1,2,0,0x8c,0);
          if (psVar13 != (sljit_u8 *)0x0) {
            iVar11 = 1;
LAB_0010b35f:
            *psVar13 = 0x89;
          }
        }
      }
      else {
        if (psVar3->error == 0) {
          iVar11 = common->ovector_start;
          psVar3->mode32 = 0;
          psVar13 = emit_x86_instruction(psVar3,1,1,0,0x8e,(long)iVar11 + uVar39 * 8);
          if (psVar13 != (sljit_u8 *)0x0) {
            *psVar13 = 0x8b;
          }
        }
        if (psVar3->error == 0) {
          iVar11 = common->ovector_start;
          psVar3->mode32 = 0;
          psVar13 = emit_x86_instruction(psVar3,1,4,0,0x8e,(long)iVar11 + uVar39 * 8 + 8);
          if (psVar13 != (sljit_u8 *)0x0) {
            *psVar13 = 0x8b;
          }
        }
        if (psVar3->error == 0) {
          psVar3->mode32 = 0;
          psVar13 = emit_x86_instruction(psVar3,1,1,0,0x8c,0);
          if (psVar13 != (sljit_u8 *)0x0) {
            *psVar13 = 0x89;
          }
        }
        iVar11 = common->capture_last_ptr;
        if (((long)iVar11 != 0) && (psVar3->error == 0)) {
          psVar3->mode32 = 0;
          psVar13 = emit_x86_instruction(psVar3,1,1,0,0x8e,(long)iVar11);
          if (psVar13 != (sljit_u8 *)0x0) {
            *psVar13 = 0x8b;
          }
        }
        if (psVar3->error == 0) {
          psVar3->mode32 = 0;
          psVar13 = emit_x86_instruction(psVar3,1,4,0,0x8c,8);
          if (psVar13 != (sljit_u8 *)0x0) {
            *psVar13 = 0x89;
          }
        }
        if ((BVar7 != 0) && (psVar3->error == 0)) {
          iVar11 = common->control_head_ptr;
          psVar3->mode32 = 0;
          psVar13 = emit_x86_instruction(psVar3,1,4,0,0x8e,(long)iVar11);
          if (psVar13 != (sljit_u8 *)0x0) {
            *psVar13 = 0x8b;
          }
        }
        iVar11 = 2;
        if ((common->capture_last_ptr != 0) && (iVar11 = 3, psVar3->error == 0)) {
          psVar3->mode32 = 0;
          psVar13 = emit_x86_instruction(psVar3,1,1,0,0x8c,0x10);
          iVar11 = 3;
          if (psVar13 != (sljit_u8 *)0x0) goto LAB_0010b35f;
        }
      }
      iVar37 = (iVar11 + 1) - (uint)(BVar7 == 0);
      if ((PVar8 != 0x95) && (psVar3->error == 0)) {
        psVar3->mode32 = 0;
        psVar13 = emit_x86_instruction(psVar3,1,0x40,1,0x8c,(ulong)(uint)(iVar37 * 8));
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 199;
        }
      }
      if ((BVar7 != 0) && (iVar37 = iVar37 + -1, psVar3->error == 0)) {
        psVar3->mode32 = 0;
        psVar13 = emit_x86_instruction(psVar3,1,4,0,0x8c,(ulong)(uint)(iVar37 * 8));
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x89;
        }
      }
    }
    else {
      iVar11 = ((uint)(PVar8 != 0x95) + iVar10 + (uint)(iVar38 == 0)) -
               (uint)(needs_control_head == 0);
      local_b0 = iVar11 + 2;
      *(uint *)&pbVar23[1].nextbacktracks = local_b0;
      psVar4 = common->compiler;
      sljit_emit_op2(psVar4,0x62,0xc,0,0xc,0,0x40,(ulong)local_b0 * 8);
      psVar14 = sljit_emit_cmp(psVar4,2,0xc,0,0xb,0);
      psVar4 = common->compiler;
      psVar15 = (stub_list *)0x0;
      if (psVar4->error == 0) {
        psVar15 = (stub_list *)ensure_abuf(psVar4,0x18);
      }
      if (psVar15 != (stub_list *)0x0) {
        psVar15->start = psVar14;
        psVar24 = sljit_emit_label(psVar4);
        psVar15->quit = psVar24;
        psVar15->next = common->stubs;
        common->stubs = psVar15;
      }
      if (psVar3->error == 0) {
        psVar3->mode32 = 0;
        psVar13 = emit_x86_instruction(psVar3,1,1,0,0x8e,lVar17);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x8b;
        }
      }
      if ((BVar7 != 0) && (psVar3->error == 0)) {
        iVar33 = common->control_head_ptr;
        psVar3->mode32 = 0;
        psVar13 = emit_x86_instruction(psVar3,1,4,0,0x8e,(long)iVar33);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x8b;
        }
      }
      iVar37 = 0;
      iVar33 = 0xc;
      sljit_emit_op2(psVar3,0x60,0x8e,lVar17,0xc,0,0x40,(ulong)local_b0 << 3);
      if ((PVar8 != 0x95) && (iVar37 = 1, psVar3->error == 0)) {
        psVar3->mode32 = 0;
        iVar37 = 1;
        iVar33 = 0x8c;
        psVar13 = emit_x86_instruction(psVar3,1,0x40,1,0x8c,0);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 199;
          iVar37 = 1;
        }
      }
      if (BVar7 != 0) {
        if (psVar3->error == 0) {
          psVar3->mode32 = 0;
          iVar33 = 0x8c;
          psVar13 = emit_x86_instruction(psVar3,1,4,0,0x8c,(ulong)(uint)(iVar37 * 8));
          if (psVar13 != (sljit_u8 *)0x0) {
            *psVar13 = 0x89;
          }
        }
        iVar37 = iVar37 + 1;
      }
      if (iVar38 == 0) {
        if (psVar3->error == 0) {
          psVar3->mode32 = 0;
          iVar33 = 0x8c;
          psVar13 = emit_x86_instruction(psVar3,1,2,0,0x8c,(ulong)(uint)(iVar37 * 8));
          if (psVar13 != (sljit_u8 *)0x0) {
            *psVar13 = 0x89;
          }
        }
        iVar37 = iVar37 + 1;
        iVar40 = -2;
      }
      else {
        iVar40 = -1;
      }
      if (psVar3->error == 0) {
        psVar3->mode32 = 0;
        iVar33 = 0x8c;
        psVar13 = emit_x86_instruction(psVar3,1,1,0,0x8c,(ulong)(uint)(iVar37 * 8));
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x89;
        }
      }
      init_frame(common,pPVar19,(PCRE2_SPTR16)0x0,iVar11 + 1,iVar33);
      iVar37 = iVar37 + iVar40;
    }
    if ((iVar38 != 0) && (psVar3->error == 0)) {
      psVar3->mode32 = 0;
      psVar13 = emit_x86_instruction(psVar3,1,2,0,0x8e,local_e0);
      if (psVar13 != (sljit_u8 *)0x0) {
        *psVar13 = 0x89;
      }
    }
    psVar24 = sljit_emit_label(psVar3);
    if (*pPVar19 == 0x7c) {
      plVar28 = (long *)0x0;
    }
    else {
      local_48 = (long)(int)local_b0 * 8;
      local_50 = (ulong)(iVar38 * 8 + 8);
      local_68 = uVar39 >> 1;
      local_58 = (ulong)(uint)(iVar38 * 8);
      local_70 = (long)(iVar10 * -8 + -0x10);
      local_60 = (long)(iVar37 << 3);
      local_a4 = (ushort)local_78 & 0xfffd;
      local_38 = (long)(int)(local_b0 * 8 + -8);
      plVar28 = (long *)0x0;
      do {
        pbVar23->top = (backtrack_common *)0x0;
        pbVar23->topbacktracks = (jump_list *)0x0;
        pPVar19 = pPVar19 + pPVar19[1];
        compile_matchingpath(common,cc_00,pPVar19,pbVar23);
        if (psVar3->error != 0) goto LAB_0010d36c;
        sVar29 = 1;
        if (iVar10 < 0) {
          if (iVar10 == -1) {
            psVar3->mode32 = 0;
            psVar13 = emit_x86_instruction(psVar3,1,0xc,0,0x8e,lVar17);
            if (psVar13 != (sljit_u8 *)0x0) {
              *psVar13 = 0x8b;
            }
          }
          if (iVar38 == 0) {
            if (((short)local_78 == 0x89) && (psVar3->error == 0)) {
              psVar3->mode32 = 0;
              psVar13 = emit_x86_instruction(psVar3,1,1,0,0x8c,0);
              if (psVar13 != (sljit_u8 *)0x0) {
                *psVar13 = 0x8b;
              }
            }
            if (psVar3->error == 0) {
              psVar3->mode32 = 0;
              sVar29 = 2;
              sVar34 = 0x8c;
              sVar35 = 0;
LAB_0010b7c9:
              psVar13 = emit_x86_instruction(psVar3,1,sVar29,0,sVar34,sVar35);
              if (psVar13 != (sljit_u8 *)0x0) {
                *psVar13 = 0x89;
              }
            }
          }
          else {
            if (psVar3->error == 0) {
              psVar3->mode32 = 0;
              psVar13 = emit_x86_instruction(psVar3,1,1,0,0x8e,local_e0);
              if (psVar13 != (sljit_u8 *)0x0) {
                *psVar13 = 0x8b;
              }
            }
            if (psVar3->error == 0) {
              iVar11 = common->ovector_start;
              psVar3->mode32 = 0;
              psVar13 = emit_x86_instruction(psVar3,1,2,0,0x8e,(long)iVar11 + local_50);
              if (psVar13 != (sljit_u8 *)0x0) {
                *psVar13 = 0x89;
              }
            }
            if (psVar3->error == 0) {
              psVar3->mode32 = 0;
              psVar13 = emit_x86_instruction(psVar3,1,2,0,0x8e,local_e0);
              if (psVar13 != (sljit_u8 *)0x0) {
                *psVar13 = 0x89;
              }
            }
            iVar11 = common->capture_last_ptr;
            if (((long)iVar11 != 0) && (psVar3->error == 0)) {
              psVar3->mode32 = 0;
              emit_mov(psVar3,0x8e,(long)iVar11,0x40,local_68);
            }
            if (psVar3->error == 0) {
              sVar35 = (long)common->ovector_start + local_58;
              psVar3->mode32 = 0;
              sVar34 = 0x8e;
              goto LAB_0010b7c9;
            }
          }
          if ((needs_control_head != 0) && (psVar3->error == 0)) {
            iVar11 = common->control_head_ptr;
            psVar3->mode32 = 0;
            emit_mov(psVar3,0x8e,(long)iVar11,0x8c,local_60);
          }
          if (local_a4 == 0x89) {
            psVar14 = sljit_emit_cmp(psVar3,0,1,0,2,0);
            plVar30 = (long *)0x0;
            if (psVar3->error == 0) {
              plVar30 = (long *)ensure_abuf(psVar3,0x10);
            }
            if (plVar30 != (long *)0x0) {
              plVar30[1] = (long)plVar28;
              *plVar30 = (long)psVar14;
              plVar28 = plVar30;
            }
          }
          if ((PVar8 != 0x95) && (psVar3->error == 0)) {
            psVar3->mode32 = 0;
            lVar36 = local_38;
LAB_0010ba79:
            psVar13 = emit_x86_instruction(psVar3,1,0x40,0,0x8c,lVar36);
            if (psVar13 != (sljit_u8 *)0x0) {
              *psVar13 = 199;
            }
          }
        }
        else {
          if (iVar38 == 0) {
            psVar3->mode32 = 0;
            psVar13 = emit_x86_instruction(psVar3,1,4,0,0x8e,lVar17);
            if (psVar13 != (sljit_u8 *)0x0) {
              *psVar13 = 0x8b;
            }
            sljit_emit_op2(psVar3,0x62,0xc,0,4,0,0x40,local_48);
            if (((short)local_78 == 0x89) && (psVar3->error == 0)) {
              psVar3->mode32 = 0;
              psVar13 = emit_x86_instruction(psVar3,1,1,0,0x84,local_70);
              if (psVar13 != (sljit_u8 *)0x0) {
                *psVar13 = 0x8b;
              }
            }
            if (psVar3->error == 0) {
              psVar3->mode32 = 0;
              sVar29 = 2;
              sVar34 = 0x84;
              lVar36 = local_70;
LAB_0010b971:
              psVar13 = emit_x86_instruction(psVar3,1,sVar29,0,sVar34,lVar36);
              if (psVar13 != (sljit_u8 *)0x0) {
                *psVar13 = 0x89;
              }
            }
          }
          else {
            sljit_emit_op2(psVar3,0x62,0xc,0,0x8e,lVar17,0x40,local_48);
            if (psVar3->error == 0) {
              psVar3->mode32 = 0;
              psVar13 = emit_x86_instruction(psVar3,1,1,0,0x8e,local_e0);
              if (psVar13 != (sljit_u8 *)0x0) {
                *psVar13 = 0x8b;
              }
            }
            if (psVar3->error == 0) {
              iVar11 = common->ovector_start;
              psVar3->mode32 = 0;
              psVar13 = emit_x86_instruction(psVar3,1,2,0,0x8e,(long)iVar11 + local_50);
              if (psVar13 != (sljit_u8 *)0x0) {
                *psVar13 = 0x89;
              }
            }
            if (psVar3->error == 0) {
              psVar3->mode32 = 0;
              psVar13 = emit_x86_instruction(psVar3,1,2,0,0x8e,local_e0);
              if (psVar13 != (sljit_u8 *)0x0) {
                *psVar13 = 0x89;
              }
            }
            iVar11 = common->capture_last_ptr;
            if (((long)iVar11 != 0) && (psVar3->error == 0)) {
              psVar3->mode32 = 0;
              emit_mov(psVar3,0x8e,(long)iVar11,0x40,local_68);
            }
            if (psVar3->error == 0) {
              lVar36 = (long)common->ovector_start + local_58;
              psVar3->mode32 = 0;
              sVar34 = 0x8e;
              goto LAB_0010b971;
            }
          }
          if ((needs_control_head != 0) && (psVar3->error == 0)) {
            iVar11 = common->control_head_ptr;
            psVar3->mode32 = 0;
            emit_mov(psVar3,0x8e,(long)iVar11,0x8c,local_60);
          }
          if (local_a4 == 0x89) {
            psVar14 = sljit_emit_cmp(psVar3,0,1,0,2,0);
            plVar30 = (long *)0x0;
            if (psVar3->error == 0) {
              plVar30 = (long *)ensure_abuf(psVar3,0x10);
            }
            if (plVar30 != (long *)0x0) {
              plVar30[1] = (long)plVar28;
              *plVar30 = (long)psVar14;
              plVar28 = plVar30;
            }
          }
          if ((PVar8 != 0x95) && (psVar3->error == 0)) {
            psVar3->mode32 = 0;
            lVar36 = 0;
            goto LAB_0010ba79;
          }
        }
        psVar14 = sljit_emit_jump(psVar3,0x18);
        if ((psVar24 != (sljit_label *)0x0) && (psVar14 != (sljit_jump *)0x0)) {
          psVar14->flags = (psVar14->flags & 0xfffffffffffffffcU) + 1;
          (psVar14->u).label = psVar24;
        }
        flush_stubs(common);
        compile_backtrackingpath(common,pbVar23->top);
        if (psVar3->error != 0) goto LAB_0010d361;
        pjVar20 = pbVar23->topbacktracks;
        psVar18 = sljit_emit_label(psVar3);
        for (; pjVar20 != (jump_list *)0x0; pjVar20 = pjVar20->next) {
          if ((psVar18 != (sljit_label *)0x0) &&
             (psVar14 = pjVar20->jump, psVar14 != (sljit_jump *)0x0)) {
            psVar14->flags = (psVar14->flags & 0xfffffffffffffffcU) + 1;
            (psVar14->u).label = psVar18;
          }
        }
        if (iVar10 < 0) {
          iVar11 = psVar3->error;
          if (iVar38 == 0) {
            if (iVar11 != 0) goto LAB_0010bc2b;
            psVar3->mode32 = 0;
            sVar29 = 0x8c;
            lVar36 = 0;
          }
          else {
joined_r0x0010bbff:
            if (iVar11 != 0) goto LAB_0010bc2b;
            psVar3->mode32 = 0;
            sVar29 = 0x8e;
            lVar36 = local_e0;
          }
LAB_0010bc1e:
          psVar13 = emit_x86_instruction(psVar3,1,2,0,sVar29,lVar36);
          if (psVar13 != (sljit_u8 *)0x0) {
            *psVar13 = 0x8b;
          }
        }
        else {
          if (iVar38 != 0) {
            if ((*pPVar19 == 0x7c) && (psVar3->error == 0)) {
              psVar3->mode32 = 0;
              psVar13 = emit_x86_instruction(psVar3,1,4,0,0x8e,lVar17);
              if (psVar13 != (sljit_u8 *)0x0) {
                *psVar13 = 0x8b;
              }
            }
            iVar11 = psVar3->error;
            goto joined_r0x0010bbff;
          }
          if (psVar3->error == 0) {
            psVar3->mode32 = 0;
            psVar13 = emit_x86_instruction(psVar3,1,4,0,0x8e,lVar17);
            if (psVar13 != (sljit_u8 *)0x0) {
              *psVar13 = 0x8b;
            }
          }
          if (psVar3->error == 0) {
            psVar3->mode32 = 0;
            sVar29 = 0x84;
            lVar36 = local_70;
            goto LAB_0010bc1e;
          }
        }
LAB_0010bc2b:
      } while ((*pPVar19 != 0x7c) && (cc_00 = pPVar19 + 2, *pPVar19 != 0x7c));
    }
    pbVar23->topbacktracks = (jump_list *)0x0;
    if (PVar8 != 0x95) {
      if (iVar10 < 0) {
        iVar10 = local_b0 * 8 + -8;
        sVar29 = 0x8c;
      }
      else {
        iVar10 = local_b0 * -8;
        sVar29 = 0x84;
      }
      psVar14 = sljit_emit_cmp(psVar3,1,sVar29,(long)iVar10,0x40,0);
      pjVar20 = (jump_list *)0x0;
      if (psVar3->error == 0) {
        pjVar20 = (jump_list *)ensure_abuf(psVar3,0x10);
      }
      if (pjVar20 != (jump_list *)0x0) {
        pjVar20->next = pbVar23->topbacktracks;
        pjVar20->jump = psVar14;
        pbVar23->topbacktracks = pjVar20;
      }
    }
    psVar24 = sljit_emit_label(psVar3);
    for (; plVar28 != (long *)0x0; plVar28 = (long *)plVar28[1]) {
      if ((psVar24 != (sljit_label *)0x0) && (lVar17 = *plVar28, lVar17 != 0)) {
        *(ulong *)(lVar17 + 0x10) = (*(ulong *)(lVar17 + 0x10) & 0xfffffffffffffffc) + 1;
        *(sljit_label **)(lVar17 + 0x18) = psVar24;
      }
    }
    psVar3 = common->compiler;
    if (psVar3->error == 0) {
      psVar3->mode32 = 0;
      psVar13 = emit_x86_instruction(psVar3,0x11,0x40,1,10,0);
      if (psVar13 != (sljit_u8 *)0x0) {
        psVar13[1] = psVar13[1] | 0x28;
      }
    }
    psVar14 = sljit_emit_jump(psVar3,0);
    if (psVar3->error == 0) {
      pjVar20 = (jump_list *)ensure_abuf(psVar3,0x10);
    }
    else {
      pjVar20 = (jump_list *)0x0;
    }
    if (pjVar20 != (jump_list *)0x0) {
      pjVar20->next = common->calllimit;
      pjVar20->jump = psVar14;
      common->calllimit = pjVar20;
    }
    pPVar19 = pPVar19 + 2;
    break;
  case 0x93:
    if (0x81 < cc[1]) goto switchD_0010a9af_caseD_82;
    goto switchD_0010a9af_caseD_7e;
  case 0x94:
    if (compiler->error == 0) {
      pbVar23 = (backtrack_common *)ensure_abuf(compiler,0x30);
    }
    else {
      pbVar23 = (backtrack_common *)0x0;
    }
    if (compiler->error != 0) {
      return;
    }
    pbVar23->cc = (PCRE2_SPTR16)0x0;
    pbVar23[1].prev = (backtrack_common *)0x0;
    pbVar23->top = (backtrack_common *)0x0;
    pbVar23->topbacktracks = (jump_list *)0x0;
    pbVar23->prev = (backtrack_common *)0x0;
    pbVar23->nextbacktracks = (jump_list *)0x0;
    pbVar23->prev = parent->top;
    pbVar23->cc = cc;
    parent->top = pbVar23;
    pPVar19 = cc + 1;
    do {
      pPVar19 = pPVar19 + pPVar19[1];
    } while (*pPVar19 == 0x78);
    psVar3 = common->compiler;
    if (*pPVar19 == 0x7b) {
      sljit_emit_op2(psVar3,0x62,0xc,0,0xc,0,0x40,0x10);
      psVar14 = sljit_emit_cmp(psVar3,2,0xc,0,0xb,0);
      psVar3 = common->compiler;
      psVar15 = (stub_list *)0x0;
      if (psVar3->error == 0) {
        psVar15 = (stub_list *)ensure_abuf(psVar3,0x18);
      }
      if (psVar15 != (stub_list *)0x0) {
        psVar15->start = psVar14;
        psVar24 = sljit_emit_label(psVar3);
        psVar15->quit = psVar24;
        psVar15->next = common->stubs;
        common->stubs = psVar15;
      }
      if (compiler->error == 0) {
        compiler->mode32 = 0;
        psVar13 = emit_x86_instruction(compiler,1,0x40,0,0x8c,0);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 199;
        }
      }
      if (compiler->error == 0) {
        compiler->mode32 = 0;
        sVar35 = 8;
LAB_0010cc34:
        psVar13 = emit_x86_instruction(compiler,1,2,0,0x8c,sVar35);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x89;
        }
      }
    }
    else {
      sljit_emit_op2(psVar3,0x62,0xc,0,0xc,0,0x40,8);
      psVar14 = sljit_emit_cmp(psVar3,2,0xc,0,0xb,0);
      psVar3 = common->compiler;
      psVar15 = (stub_list *)0x0;
      if (psVar3->error == 0) {
        psVar15 = (stub_list *)ensure_abuf(psVar3,0x18);
      }
      if (psVar15 != (stub_list *)0x0) {
        psVar15->start = psVar14;
        psVar24 = sljit_emit_label(psVar3);
        psVar15->quit = psVar24;
        psVar15->next = common->stubs;
        common->stubs = psVar15;
      }
      if (compiler->error == 0) {
        compiler->mode32 = 0;
        sVar35 = 0;
        goto LAB_0010cc34;
      }
    }
    pbVar21 = (backtrack_common *)sljit_emit_label(compiler);
    pbVar23[1].prev = pbVar21;
    psVar3 = common->compiler;
    if (psVar3->error == 0) {
      psVar3->mode32 = 0;
      psVar13 = emit_x86_instruction(psVar3,0x11,0x40,1,10,0);
      if (psVar13 != (sljit_u8 *)0x0) {
        psVar13[1] = psVar13[1] | 0x28;
      }
    }
    psVar14 = sljit_emit_jump(psVar3,0);
    if (psVar3->error == 0) {
      pjVar20 = (jump_list *)ensure_abuf(psVar3,0x10);
    }
    else {
      pjVar20 = (jump_list *)0x0;
    }
    pPVar19 = pPVar19 + 2;
    if (pjVar20 != (jump_list *)0x0) {
      pjVar20->next = common->calllimit;
      pjVar20->jump = psVar14;
      common->calllimit = pjVar20;
    }
    break;
  case 0x96:
    if (compiler->error == 0) {
      pbVar23 = (backtrack_common *)ensure_abuf(compiler,0x28);
    }
    else {
      pbVar23 = (backtrack_common *)0x0;
    }
    if (compiler->error != 0) {
      return;
    }
    pbVar23->cc = (PCRE2_SPTR16)0x0;
    pbVar23->top = (backtrack_common *)0x0;
    pbVar23->topbacktracks = (jump_list *)0x0;
    pbVar23->prev = (backtrack_common *)0x0;
    pbVar23->nextbacktracks = (jump_list *)0x0;
    pbVar23->prev = parent->top;
    pbVar23->cc = cc;
    parent->top = pbVar23;
    if (compiler->error == 0) {
      iVar10 = common->mark_ptr;
      compiler->mode32 = 0;
      psVar13 = emit_x86_instruction(compiler,1,4,0,0x8e,(long)iVar10);
      if (psVar13 != (sljit_u8 *)0x0) {
        *psVar13 = 0x8b;
      }
    }
    psVar3 = common->compiler;
    sljit_emit_op2(psVar3,0x62,0xc,0,0xc,0,0x40,(ulong)(common->has_skip_arg != 0) << 5 | 8);
    psVar14 = sljit_emit_cmp(psVar3,2,0xc,0,0xb,0);
    psVar3 = common->compiler;
    psVar15 = (stub_list *)0x0;
    if (psVar3->error == 0) {
      psVar15 = (stub_list *)ensure_abuf(psVar3,0x18);
    }
    if (psVar15 != (stub_list *)0x0) {
      psVar15->start = psVar14;
      psVar24 = sljit_emit_label(psVar3);
      psVar15->quit = psVar24;
      psVar15->next = common->stubs;
      common->stubs = psVar15;
    }
    if (compiler->error == 0) {
      compiler->mode32 = 0;
      psVar13 = emit_x86_instruction(compiler,1,9,0,1,0);
      if (psVar13 != (sljit_u8 *)0x0) {
        *psVar13 = 0x89;
      }
    }
    if (compiler->error == 0) {
      iVar10 = common->has_skip_arg;
      compiler->mode32 = 0;
      psVar13 = emit_x86_instruction(compiler,1,4,0,0x8c,(ulong)(iVar10 != 0) << 5);
      if (psVar13 != (sljit_u8 *)0x0) {
        *psVar13 = 0x89;
      }
    }
    if (compiler->error == 0) {
      compiler->mode32 = 0;
      emit_mov(compiler,4,0,0x40,(sljit_sw)(cc + 2));
    }
    if (compiler->error == 0) {
      iVar10 = common->mark_ptr;
      compiler->mode32 = 0;
      psVar13 = emit_x86_instruction(compiler,1,4,0,0x8e,(long)iVar10);
      if (psVar13 != (sljit_u8 *)0x0) {
        *psVar13 = 0x89;
      }
    }
    if (compiler->error == 0) {
      compiler->mode32 = 0;
      psVar13 = emit_x86_instruction(compiler,1,4,0,0x81,0x30);
      if (psVar13 != (sljit_u8 *)0x0) {
        *psVar13 = 0x89;
      }
    }
    if (common->has_skip_arg != 0) {
      if (compiler->error == 0) {
        iVar10 = common->control_head_ptr;
        compiler->mode32 = 0;
        psVar13 = emit_x86_instruction(compiler,1,1,0,0x8e,(long)iVar10);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x8b;
        }
      }
      if (compiler->error == 0) {
        iVar10 = common->control_head_ptr;
        compiler->mode32 = 0;
        psVar13 = emit_x86_instruction(compiler,1,0xc,0,0x8e,(long)iVar10);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x89;
        }
      }
      if (compiler->error == 0) {
        compiler->mode32 = 0;
        psVar13 = emit_x86_instruction(compiler,1,0x40,0,0x8c,8);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 199;
        }
      }
      if (compiler->error == 0) {
        compiler->mode32 = 0;
        emit_mov(compiler,0x8c,0x10,0x40,(sljit_sw)(cc + 2));
      }
      if (compiler->error == 0) {
        compiler->mode32 = 0;
        psVar13 = emit_x86_instruction(compiler,1,2,0,0x8c,0x18);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x89;
        }
      }
      if (compiler->error == 0) {
        compiler->mode32 = 0;
        psVar13 = emit_x86_instruction(compiler,1,1,0,0x8c,0);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x89;
        }
      }
    }
    pPVar19 = cc + (ulong)cc[1] + 3;
    break;
  case 0x97:
  case 0x98:
  case 0x99:
  case 0x9a:
  case 0x9b:
  case 0x9c:
  case 0x9d:
  case 0x9e:
    pPVar19 = cc + 1;
    uVar9 = uVar2 - 0x98;
    if ((uVar9 < 7) && ((0x55U >> (uVar9 & 0x1f) & 1) != 0)) {
      pPVar19 = pPVar19 + (ulong)*pPVar19 + 2;
    }
    psVar3 = common->compiler;
    if (psVar3->error == 0) {
      pbVar23 = (backtrack_common *)ensure_abuf(psVar3,0x28);
    }
    else {
      pbVar23 = (backtrack_common *)0x0;
    }
    if (psVar3->error != 0) goto LAB_0010d361;
    pbVar23->top = (backtrack_common *)0x0;
    pbVar23->topbacktracks = (jump_list *)0x0;
    pbVar23->prev = (backtrack_common *)0x0;
    pbVar23->nextbacktracks = (jump_list *)0x0;
    pbVar23->cc = (PCRE2_SPTR16)0x0;
    pbVar23->prev = parent->top;
    pbVar23->cc = cc;
    parent->top = pbVar23;
    switch(uVar9) {
    case 0:
    case 4:
    case 6:
      if (psVar3->error == 0) {
        psVar3->mode32 = 0;
        psVar13 = emit_x86_instruction(psVar3,1,9,0,1,0);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x89;
        }
      }
      if (psVar3->error == 0) {
        psVar3->mode32 = 0;
        emit_mov(psVar3,4,0,0x40,(sljit_sw)(cc + 2));
      }
      if (psVar3->error == 0) {
        iVar10 = common->mark_ptr;
        psVar3->mode32 = 0;
        psVar13 = emit_x86_instruction(psVar3,1,4,0,0x8e,(long)iVar10);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x89;
        }
      }
      if (psVar3->error == 0) {
        psVar3->mode32 = 0;
        psVar13 = emit_x86_instruction(psVar3,1,4,0,0x81,0x30);
joined_r0x0010d1d0:
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x89;
        }
      }
      break;
    case 1:
      psVar4 = common->compiler;
      sljit_emit_op2(psVar4,0x62,0xc,0,0xc,0,0x40,8);
      psVar14 = sljit_emit_cmp(psVar4,2,0xc,0,0xb,0);
      psVar4 = common->compiler;
      psVar15 = (stub_list *)0x0;
      if (psVar4->error == 0) {
        psVar15 = (stub_list *)ensure_abuf(psVar4,0x18);
      }
      if (psVar15 != (stub_list *)0x0) {
        psVar15->start = psVar14;
        psVar24 = sljit_emit_label(psVar4);
        psVar15->quit = psVar24;
        psVar15->next = common->stubs;
        common->stubs = psVar15;
      }
      if (psVar3->error == 0) {
        psVar3->mode32 = 0;
        psVar13 = emit_x86_instruction(psVar3,1,2,0,0x8c,0);
        goto joined_r0x0010d1d0;
      }
    }
    break;
  case 0x9f:
  case 0xa0:
  case 0xa1:
    psVar3 = common->compiler;
    if (psVar3->error == 0) {
      pbVar23 = (backtrack_common *)ensure_abuf(psVar3,0x28);
    }
    else {
      pbVar23 = (backtrack_common *)0x0;
    }
    if (psVar3->error != 0) goto LAB_0010d361;
    pbVar23->cc = (PCRE2_SPTR16)0x0;
    pbVar23->top = (backtrack_common *)0x0;
    ((anon_union_8_2_cb96b71c_for_u *)&pbVar23->topbacktracks)->target = 0;
    pbVar23->prev = (backtrack_common *)0x0;
    pbVar23->nextbacktracks = (jump_list *)0x0;
    pbVar23->prev = parent->top;
    pbVar23->cc = cc;
    parent->top = pbVar23;
    if (*cc == 0xa0) {
      if ((common->currententry == (recurse_entry *)0x0) &&
         ((common->re->overall_options & 0x20000000) != 0)) {
        psVar14 = sljit_emit_cmp(psVar3,1,2,0,0xd,0);
        pjVar20 = (jump_list *)0x0;
        if (psVar3->error == 0) {
          pjVar20 = (jump_list *)ensure_abuf(psVar3,0x10);
        }
        if (pjVar20 != (jump_list *)0x0) {
          pjVar20->next = common->reset_match;
          pjVar20->jump = psVar14;
          common->reset_match = pjVar20;
        }
      }
LAB_0010c72f:
      if (((*cc != 0xa1) && (common->currententry == (recurse_entry *)0x0)) &&
         (common->might_be_empty != 0)) {
        if (common->accept_label == (sljit_label *)0x0) {
          psVar14 = sljit_emit_cmp(psVar3,1,2,0,0x8e,(long)common->ovector_start);
          pjVar20 = (jump_list *)0x0;
          if (psVar3->error == 0) {
            pjVar20 = (jump_list *)ensure_abuf(psVar3,0x10);
          }
          if (pjVar20 != (jump_list *)0x0) {
            pjVar20->next = common->accept;
            pjVar20->jump = psVar14;
            common->accept = pjVar20;
          }
        }
        else {
          psVar14 = sljit_emit_cmp(psVar3,1,2,0,0x8e,(long)common->ovector_start);
          if ((psVar14 != (sljit_jump *)0x0) &&
             (psVar24 = common->accept_label, psVar24 != (sljit_label *)0x0)) {
            psVar14->flags = (psVar14->flags & 0xfffffffffffffffcU) + 1;
            (psVar14->u).target = (sljit_uw)psVar24;
          }
        }
        if (psVar3->error == 0) {
          psVar3->mode32 = 0;
          psVar13 = emit_x86_instruction(psVar3,1,9,0,1,0);
          if (psVar13 != (sljit_u8 *)0x0) {
            *psVar13 = 0x89;
          }
        }
        if (psVar3->error == 0) {
          psVar3->mode32 = 1;
          psVar13 = emit_x86_instruction(psVar3,1,4,0,0x81,0x58);
          if (psVar13 == (sljit_u8 *)0x0) {
            if (psVar3->error != 0) goto LAB_0010cf66;
          }
          else {
            *psVar13 = 0x8b;
          }
          psVar3->mode32 = 0;
        }
LAB_0010cf66:
        if (psVar3->error == 0) {
          psVar3->mode32 = 0;
          psVar13 = emit_x86_instruction(psVar3,1,0x40,4,4,0);
          if (psVar13 != (sljit_u8 *)0x0) {
            *psVar13 = 0xf7;
          }
        }
        psVar14 = sljit_emit_jump(psVar3,1);
        if (psVar3->error == 0) {
          psVar24 = (sljit_label *)ensure_abuf(psVar3,0x10);
        }
        else {
          psVar24 = (sljit_label *)0x0;
        }
        if (psVar24 != (sljit_label *)0x0) {
          psVar24->addr = (sljit_uw)*(anon_union_8_2_cb96b71c_for_u *)&pbVar23->topbacktracks;
          psVar24->next = (sljit_label *)psVar14;
          ((anon_union_8_2_cb96b71c_for_u *)&pbVar23->topbacktracks)->label = psVar24;
        }
        if (psVar3->error == 0) {
          psVar3->mode32 = 0;
          psVar13 = emit_x86_instruction(psVar3,1,0x40,8,4,0);
          if (psVar13 != (sljit_u8 *)0x0) {
            *psVar13 = 0xf7;
          }
        }
        psVar24 = common->accept_label;
        psVar14 = sljit_emit_jump(psVar3,0);
        if (psVar24 == (sljit_label *)0x0) {
          if (psVar3->error == 0) {
            pjVar20 = (jump_list *)ensure_abuf(psVar3,0x10);
          }
          else {
            pjVar20 = (jump_list *)0x0;
          }
          if (pjVar20 != (jump_list *)0x0) {
            pjVar20->next = common->accept;
            pjVar20->jump = psVar14;
            common->accept = pjVar20;
          }
        }
        else if ((psVar14 != (sljit_jump *)0x0) &&
                (psVar24 = common->accept_label, psVar24 != (sljit_label *)0x0)) {
          psVar14->flags = (psVar14->flags & 0xfffffffffffffffcU) + 1;
          (psVar14->u).target = (sljit_uw)psVar24;
        }
        if (psVar3->error == 0) {
          psVar3->mode32 = 0;
          psVar13 = emit_x86_instruction(psVar3,1,4,0,0x81,8);
          if (psVar13 != (sljit_u8 *)0x0) {
            *psVar13 = 0x8b;
          }
        }
        psVar24 = common->accept_label;
        psVar14 = sljit_emit_cmp(psVar3,1,4,0,2,0);
        if (psVar24 == (sljit_label *)0x0) {
          if (psVar3->error == 0) {
            pjVar20 = (jump_list *)ensure_abuf(psVar3,0x10);
          }
          else {
            pjVar20 = (jump_list *)0x0;
          }
          if (pjVar20 != (jump_list *)0x0) {
            pjVar20->next = common->accept;
            pjVar20->jump = psVar14;
            common->accept = pjVar20;
          }
        }
        else if ((psVar14 != (sljit_jump *)0x0) &&
                (psVar24 = common->accept_label, psVar24 != (sljit_label *)0x0)) {
          psVar14->flags = (psVar14->flags & 0xfffffffffffffffcU) + 1;
          (psVar14->u).target = (sljit_uw)psVar24;
        }
        goto LAB_0010ac74;
      }
      psVar24 = common->accept_label;
      pbVar23 = (backtrack_common *)sljit_emit_jump(psVar3,0x18);
      if (psVar24 != (sljit_label *)0x0) {
        if ((pbVar23 == (backtrack_common *)0x0) ||
           (psVar24 = common->accept_label, psVar24 == (sljit_label *)0x0)) goto LAB_0010c791;
        pbVar23->top = (backtrack_common *)(((ulong)pbVar23->top & 0xfffffffffffffffc) + 1);
        goto LAB_0010c78d;
      }
      if (psVar3->error == 0) {
        pjVar20 = (jump_list *)ensure_abuf(psVar3,0x10);
      }
      else {
        pjVar20 = (jump_list *)0x0;
      }
      if (pjVar20 != (jump_list *)0x0) {
        pjVar20->next = common->accept;
        pjVar20->jump = (sljit_jump *)pbVar23;
        common->accept = pjVar20;
      }
    }
    else {
      if (*cc != 0x9f) goto LAB_0010c72f;
LAB_0010ac74:
      psVar14 = sljit_emit_jump(psVar3,0x18);
      if (psVar3->error == 0) {
        psVar24 = (sljit_label *)ensure_abuf(psVar3,0x10);
      }
      else {
        psVar24 = (sljit_label *)0x0;
      }
      if (psVar24 != (sljit_label *)0x0) {
        psVar24->addr = (sljit_uw)*(anon_union_8_2_cb96b71c_for_u *)&pbVar23->topbacktracks;
        psVar24->next = (sljit_label *)psVar14;
LAB_0010c78d:
        ((anon_union_8_2_cb96b71c_for_u *)&pbVar23->topbacktracks)->label = psVar24;
      }
    }
LAB_0010c791:
    pPVar19 = cc + 1;
    break;
  case 0xa2:
    if (common->currententry == (recurse_entry *)0x0) {
      psVar3 = common->compiler;
      uVar2 = cc[1];
      sVar1 = common->optimized_cbracket[uVar2];
      if ((sVar1 == '\0') && (psVar3->error == 0)) {
        iVar10 = common->cbra_ptr;
        psVar3->mode32 = 0;
        psVar13 = emit_x86_instruction(psVar3,1,1,0,0x8e,(long)iVar10 + (ulong)uVar2 * 8);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x8b;
        }
      }
      if (psVar3->error == 0) {
        iVar10 = common->ovector_start;
        psVar3->mode32 = 0;
        psVar13 = emit_x86_instruction(psVar3,1,2,0,0x8e,(long)iVar10 + (ulong)uVar2 * 0x10 + 8);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x89;
        }
      }
      if ((sVar1 == '\0') && (psVar3->error == 0)) {
        iVar10 = common->ovector_start;
        psVar3->mode32 = 0;
        psVar13 = emit_x86_instruction(psVar3,1,1,0,0x8e,(ulong)uVar2 * 0x10 + (long)iVar10);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x89;
        }
      }
    }
    goto LAB_0010cdf1;
  case 0xa3:
    cc = cc + 1;
    do {
      cc = cc + cc[1];
    } while (*cc == 0x78);
LAB_0010cdf1:
    pPVar19 = cc + 2;
  }
switchD_0010aa91_caseD_2:
  cc = pPVar19;
  if (pPVar19 == (PCRE2_SPTR16)0x0) {
switchD_0010a9af_caseD_62:
    return;
  }
  goto LAB_0010a983;
switchD_0010a9af_caseD_7e:
  if (compiler->error == 0) {
    backtrack = (assert_backtrack *)ensure_abuf(compiler,0x40);
  }
  else {
    backtrack = (assert_backtrack *)0x0;
  }
  if (compiler->error != 0) {
    return;
  }
  backtrack->framesize = 0;
  backtrack->private_data_ptr = 0;
  backtrack->matchingpath = (sljit_label *)0x0;
  (backtrack->common).cc = (PCRE2_SPTR16)0x0;
  backtrack->condfailed = (jump_list *)0x0;
  (backtrack->common).top = (backtrack_common *)0x0;
  (backtrack->common).topbacktracks = (jump_list *)0x0;
  (backtrack->common).prev = (backtrack_common *)0x0;
  (backtrack->common).nextbacktracks = (jump_list *)0x0;
  (backtrack->common).prev = parent->top;
  (backtrack->common).cc = cc;
  parent->top = &backtrack->common;
  pPVar19 = compile_assert_matchingpath(common,cc,backtrack,0);
  goto switchD_0010aa91_caseD_2;
}

Assistant:

static void compile_matchingpath(compiler_common *common, PCRE2_SPTR cc, PCRE2_SPTR ccend, backtrack_common *parent)
{
DEFINE_COMPILER;
backtrack_common *backtrack;
BOOL has_then_trap = FALSE;
then_trap_backtrack *save_then_trap = NULL;

SLJIT_ASSERT(*ccend == OP_END || (*ccend >= OP_ALT && *ccend <= OP_KETRPOS));

if (common->has_then && common->then_offsets[cc - common->start] != 0)
  {
  SLJIT_ASSERT(*ccend != OP_END && common->control_head_ptr != 0);
  has_then_trap = TRUE;
  save_then_trap = common->then_trap;
  /* Tail item on backtrack. */
  compile_then_trap_matchingpath(common, cc, ccend, parent);
  }

while (cc < ccend)
  {
  switch(*cc)
    {
    case OP_SOD:
    case OP_SOM:
    case OP_NOT_WORD_BOUNDARY:
    case OP_WORD_BOUNDARY:
    case OP_EODN:
    case OP_EOD:
    case OP_DOLL:
    case OP_DOLLM:
    case OP_CIRC:
    case OP_CIRCM:
    case OP_REVERSE:
    cc = compile_simple_assertion_matchingpath(common, *cc, cc + 1, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks);
    break;

    case OP_NOT_DIGIT:
    case OP_DIGIT:
    case OP_NOT_WHITESPACE:
    case OP_WHITESPACE:
    case OP_NOT_WORDCHAR:
    case OP_WORDCHAR:
    case OP_ANY:
    case OP_ALLANY:
    case OP_ANYBYTE:
    case OP_NOTPROP:
    case OP_PROP:
    case OP_ANYNL:
    case OP_NOT_HSPACE:
    case OP_HSPACE:
    case OP_NOT_VSPACE:
    case OP_VSPACE:
    case OP_EXTUNI:
    case OP_NOT:
    case OP_NOTI:
    cc = compile_char1_matchingpath(common, *cc, cc + 1, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks, TRUE);
    break;

    case OP_SET_SOM:
    PUSH_BACKTRACK_NOVALUE(sizeof(backtrack_common), cc);
    OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(0));
    allocate_stack(common, 1);
    OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), OVECTOR(0), STR_PTR, 0);
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), TMP2, 0);
    cc++;
    break;

    case OP_CHAR:
    case OP_CHARI:
    if (common->mode == PCRE2_JIT_COMPLETE)
      cc = compile_charn_matchingpath(common, cc, ccend, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks);
    else
      cc = compile_char1_matchingpath(common, *cc, cc + 1, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks, TRUE);
    break;

    case OP_STAR:
    case OP_MINSTAR:
    case OP_PLUS:
    case OP_MINPLUS:
    case OP_QUERY:
    case OP_MINQUERY:
    case OP_UPTO:
    case OP_MINUPTO:
    case OP_EXACT:
    case OP_POSSTAR:
    case OP_POSPLUS:
    case OP_POSQUERY:
    case OP_POSUPTO:
    case OP_STARI:
    case OP_MINSTARI:
    case OP_PLUSI:
    case OP_MINPLUSI:
    case OP_QUERYI:
    case OP_MINQUERYI:
    case OP_UPTOI:
    case OP_MINUPTOI:
    case OP_EXACTI:
    case OP_POSSTARI:
    case OP_POSPLUSI:
    case OP_POSQUERYI:
    case OP_POSUPTOI:
    case OP_NOTSTAR:
    case OP_NOTMINSTAR:
    case OP_NOTPLUS:
    case OP_NOTMINPLUS:
    case OP_NOTQUERY:
    case OP_NOTMINQUERY:
    case OP_NOTUPTO:
    case OP_NOTMINUPTO:
    case OP_NOTEXACT:
    case OP_NOTPOSSTAR:
    case OP_NOTPOSPLUS:
    case OP_NOTPOSQUERY:
    case OP_NOTPOSUPTO:
    case OP_NOTSTARI:
    case OP_NOTMINSTARI:
    case OP_NOTPLUSI:
    case OP_NOTMINPLUSI:
    case OP_NOTQUERYI:
    case OP_NOTMINQUERYI:
    case OP_NOTUPTOI:
    case OP_NOTMINUPTOI:
    case OP_NOTEXACTI:
    case OP_NOTPOSSTARI:
    case OP_NOTPOSPLUSI:
    case OP_NOTPOSQUERYI:
    case OP_NOTPOSUPTOI:
    case OP_TYPESTAR:
    case OP_TYPEMINSTAR:
    case OP_TYPEPLUS:
    case OP_TYPEMINPLUS:
    case OP_TYPEQUERY:
    case OP_TYPEMINQUERY:
    case OP_TYPEUPTO:
    case OP_TYPEMINUPTO:
    case OP_TYPEEXACT:
    case OP_TYPEPOSSTAR:
    case OP_TYPEPOSPLUS:
    case OP_TYPEPOSQUERY:
    case OP_TYPEPOSUPTO:
    cc = compile_iterator_matchingpath(common, cc, parent);
    break;

    case OP_CLASS:
    case OP_NCLASS:
    if (cc[1 + (32 / sizeof(PCRE2_UCHAR))] >= OP_CRSTAR && cc[1 + (32 / sizeof(PCRE2_UCHAR))] <= OP_CRPOSRANGE)
      cc = compile_iterator_matchingpath(common, cc, parent);
    else
      cc = compile_char1_matchingpath(common, *cc, cc + 1, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks, TRUE);
    break;

#if defined SUPPORT_UNICODE || PCRE2_CODE_UNIT_WIDTH == 16 || PCRE2_CODE_UNIT_WIDTH == 32
    case OP_XCLASS:
    if (*(cc + GET(cc, 1)) >= OP_CRSTAR && *(cc + GET(cc, 1)) <= OP_CRPOSRANGE)
      cc = compile_iterator_matchingpath(common, cc, parent);
    else
      cc = compile_char1_matchingpath(common, *cc, cc + 1, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks, TRUE);
    break;
#endif

    case OP_REF:
    case OP_REFI:
    if (cc[1 + IMM2_SIZE] >= OP_CRSTAR && cc[1 + IMM2_SIZE] <= OP_CRPOSRANGE)
      cc = compile_ref_iterator_matchingpath(common, cc, parent);
    else
      {
      compile_ref_matchingpath(common, cc, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks, TRUE, FALSE);
      cc += 1 + IMM2_SIZE;
      }
    break;

    case OP_DNREF:
    case OP_DNREFI:
    if (cc[1 + 2 * IMM2_SIZE] >= OP_CRSTAR && cc[1 + 2 * IMM2_SIZE] <= OP_CRPOSRANGE)
      cc = compile_ref_iterator_matchingpath(common, cc, parent);
    else
      {
      compile_dnref_search(common, cc, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks);
      compile_ref_matchingpath(common, cc, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks, TRUE, FALSE);
      cc += 1 + 2 * IMM2_SIZE;
      }
    break;

    case OP_RECURSE:
    cc = compile_recurse_matchingpath(common, cc, parent);
    break;

    case OP_CALLOUT:
    case OP_CALLOUT_STR:
    cc = compile_callout_matchingpath(common, cc, parent);
    break;

    case OP_ASSERT:
    case OP_ASSERT_NOT:
    case OP_ASSERTBACK:
    case OP_ASSERTBACK_NOT:
    PUSH_BACKTRACK_NOVALUE(sizeof(assert_backtrack), cc);
    cc = compile_assert_matchingpath(common, cc, BACKTRACK_AS(assert_backtrack), FALSE);
    break;

    case OP_BRAMINZERO:
    PUSH_BACKTRACK_NOVALUE(sizeof(braminzero_backtrack), cc);
    cc = bracketend(cc + 1);
    if (*(cc - 1 - LINK_SIZE) != OP_KETRMIN)
      {
      allocate_stack(common, 1);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), STR_PTR, 0);
      }
    else
      {
      allocate_stack(common, 2);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), SLJIT_IMM, 0);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(1), STR_PTR, 0);
      }
    BACKTRACK_AS(braminzero_backtrack)->matchingpath = LABEL();
    count_match(common);
    break;

    case OP_ONCE:
    case OP_BRA:
    case OP_CBRA:
    case OP_COND:
    case OP_SBRA:
    case OP_SCBRA:
    case OP_SCOND:
    cc = compile_bracket_matchingpath(common, cc, parent);
    break;

    case OP_BRAZERO:
    if (cc[1] > OP_ASSERTBACK_NOT)
      cc = compile_bracket_matchingpath(common, cc, parent);
    else
      {
      PUSH_BACKTRACK_NOVALUE(sizeof(assert_backtrack), cc);
      cc = compile_assert_matchingpath(common, cc, BACKTRACK_AS(assert_backtrack), FALSE);
      }
    break;

    case OP_BRAPOS:
    case OP_CBRAPOS:
    case OP_SBRAPOS:
    case OP_SCBRAPOS:
    case OP_BRAPOSZERO:
    cc = compile_bracketpos_matchingpath(common, cc, parent);
    break;

    case OP_MARK:
    PUSH_BACKTRACK_NOVALUE(sizeof(backtrack_common), cc);
    SLJIT_ASSERT(common->mark_ptr != 0);
    OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(SLJIT_SP), common->mark_ptr);
    allocate_stack(common, common->has_skip_arg ? 5 : 1);
    OP1(SLJIT_MOV, TMP1, 0, ARGUMENTS, 0);
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(common->has_skip_arg ? 4 : 0), TMP2, 0);
    OP1(SLJIT_MOV, TMP2, 0, SLJIT_IMM, (sljit_sw)(cc + 2));
    OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), common->mark_ptr, TMP2, 0);
    OP1(SLJIT_MOV, SLJIT_MEM1(TMP1), SLJIT_OFFSETOF(jit_arguments, mark_ptr), TMP2, 0);
    if (common->has_skip_arg)
      {
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), common->control_head_ptr);
      OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), common->control_head_ptr, STACK_TOP, 0);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(1), SLJIT_IMM, type_mark);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(2), SLJIT_IMM, (sljit_sw)(cc + 2));
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(3), STR_PTR, 0);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), TMP1, 0);
      }
    cc += 1 + 2 + cc[1];
    break;

    case OP_PRUNE:
    case OP_PRUNE_ARG:
    case OP_SKIP:
    case OP_SKIP_ARG:
    case OP_THEN:
    case OP_THEN_ARG:
    case OP_COMMIT:
    case OP_COMMIT_ARG:
    cc = compile_control_verb_matchingpath(common, cc, parent);
    break;

    case OP_FAIL:
    case OP_ACCEPT:
    case OP_ASSERT_ACCEPT:
    cc = compile_fail_accept_matchingpath(common, cc, parent);
    break;

    case OP_CLOSE:
    cc = compile_close_matchingpath(common, cc);
    break;

    case OP_SKIPZERO:
    cc = bracketend(cc + 1);
    break;

    default:
    SLJIT_UNREACHABLE();
    return;
    }
  if (cc == NULL)
    return;
  }

if (has_then_trap)
  {
  /* Head item on backtrack. */
  PUSH_BACKTRACK_NOVALUE(sizeof(then_trap_backtrack), cc);
  BACKTRACK_AS(then_trap_backtrack)->common.cc = then_trap_opcode;
  BACKTRACK_AS(then_trap_backtrack)->then_trap = common->then_trap;
  common->then_trap = save_then_trap;
  }
SLJIT_ASSERT(cc == ccend);
}